

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_vector_set(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  operand local_190;
  operation local_18c;
  operand local_188 [2];
  operation local_180;
  operand local_17c [2];
  operation local_174;
  operand local_170 [2];
  operation local_168 [2];
  operand local_160 [2];
  operation local_158;
  operand local_154;
  operation local_150 [4];
  operand local_140 [2];
  operation local_138 [2];
  operand local_130 [2];
  operation local_128;
  operand local_124 [2];
  operation local_11c;
  long local_118;
  operand local_110 [2];
  operation local_108;
  operand local_104 [2];
  operation local_fc;
  undefined1 local_f8 [8];
  string not_in_bounds;
  string in_bounds;
  operand local_b0;
  operand local_ac;
  operation local_a8;
  operation local_a4;
  int local_a0;
  operand local_9c;
  operand local_98;
  operation local_94;
  unsigned_long local_90;
  operand local_84 [2];
  operation local_7c [3];
  operand local_70 [2];
  operation local_68 [4];
  string local_58;
  undefined1 local_38 [8];
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  error.field_2._8_8_ = ops;
  std::__cxx11::string::string((string *)local_38);
  psVar1 = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_58,psVar1,lab);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_68[0] = CMP;
    local_70[1] = 0x14;
    local_70[0] = NUMBER;
    local_7c[2] = 3;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_68,local_70 + 1,local_70,(int *)(local_7c + 2));
    local_7c[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_7c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    jump_short_if_arg_is_not_block(code,RCX,R11,(string *)local_38);
  }
  local_7c[0] = AND;
  local_84[1] = 0xb;
  local_84[0] = NUMBER;
  local_90 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_7c,local_84 + 1,local_84,&local_90);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    jump_short_if_arg_does_not_point_to_vector(code,RCX,R11,(string *)local_38);
    local_94 = TEST;
    local_98 = RDX;
    local_9c = NUMBER;
    local_a0 = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&stack0xffffffffffffff6c,&stack0xffffffffffffff68,&stack0xffffffffffffff64,
               &stack0xffffffffffffff60);
    local_a4 = JNES;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,&stack0xffffffffffffff5c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  }
  local_a8 = SAR;
  local_ac = RDX;
  local_b0 = NUMBER;
  in_bounds.field_2._12_4_ = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&stack0xffffffffffffff58,&stack0xffffffffffffff54,&stack0xffffffffffffff50,
             (int *)(in_bounds.field_2._M_local_buf + 0xc));
  psVar1 = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_((string *)((long)&not_in_bounds.field_2 + 8),psVar1,lab_00);
    psVar1 = label;
    label = label + 1;
    label_to_string_abi_cxx11_((string *)local_f8,psVar1,lab_01);
    local_fc = MOV;
    local_104[1] = 9;
    local_104[0] = MEM_RCX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,&local_fc,local_104 + 1,local_104);
    local_108 = MOV;
    local_110[1] = 0x18;
    local_110[0] = NUMBER;
    local_118 = 0xffffffffffffff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
              (code,&local_108,local_110 + 1,local_110,&local_118);
    local_11c = AND;
    local_124[1] = 9;
    local_124[0] = R15;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,&local_11c,local_124 + 1,local_124);
    local_128 = CMP;
    local_130[1] = 0xc;
    local_130[0] = RAX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,&local_128,local_130 + 1,local_130);
    local_138[1] = 0x3c;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_138 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    local_138[0] = CMP;
    local_140[1] = 0xc;
    local_140[0] = NUMBER;
    local_150[3] = 0;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_138,local_140 + 1,local_140,(int *)(local_150 + 3));
    local_150[2] = 0x3c;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_150 + 2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&not_in_bounds.field_2 + 8));
    error_label(code,(string *)local_f8,re_vector_set_out_of_bounds);
    local_150[1] = 0x3e;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_150 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&not_in_bounds.field_2 + 8));
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)(not_in_bounds.field_2._M_local_buf + 8));
  }
  local_150[0] = INC;
  local_154 = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_150,&local_154);
  local_158 = SHL;
  local_160[1] = 0xc;
  local_160[0] = NUMBER;
  local_168[1] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_158,local_160 + 1,local_160,(int *)(local_168 + 1));
  local_168[0] = ADD;
  local_170[1] = 0xb;
  local_170[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_168,local_170 + 1,local_170);
  local_174 = MOV;
  local_17c[1] = 9;
  local_17c[0] = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_174,local_17c + 1,local_17c);
  local_180 = MOV;
  local_188[1] = 0x1b;
  local_188[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_180,local_188 + 1,local_188);
  local_18c = JMP;
  local_190 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_18c,&local_190);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    error_label(code,(string *)local_38,re_vector_set_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_vector_set(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
    code.add(asmcode::JNES, error);
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  // here check whether it is a vector
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_vector(code, asmcode::RCX, asmcode::R11, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::SAR, asmcode::RDX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    {
    // optionally, check whether rdx is in bounds.
    std::string in_bounds = label_to_string(label++);
    std::string not_in_bounds = label_to_string(label++);
    code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
    code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, block_size_mask);
    code.add(asmcode::AND, asmcode::RAX, asmcode::R15); // get size of vector
    code.add(asmcode::CMP, asmcode::RDX, asmcode::RAX);
    code.add(asmcode::JGES, not_in_bounds);
    code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, 0);
    code.add(asmcode::JGES, in_bounds);
    error_label(code, not_in_bounds, re_vector_set_out_of_bounds);
    code.add(asmcode::LABEL, in_bounds);
    }

  code.add(asmcode::INC, asmcode::RDX); // increase 1 for header
  code.add(asmcode::SHL, asmcode::RDX, asmcode::NUMBER, 3);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::RDX);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RSI);
  code.add(asmcode::MOV, asmcode::MEM_RCX, asmcode::RAX);

  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_vector_set_contract_violation);
    }
  }